

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_ciphersuites.c
# Opt level: O0

int mbedtls_ssl_ciphersuite_uses_psk(mbedtls_ssl_ciphersuite_t *info)

{
  mbedtls_ssl_ciphersuite_t *info_local;
  
  info_local._4_4_ = (uint)(info->key_exchange - MBEDTLS_KEY_EXCHANGE_PSK < 4);
  return info_local._4_4_;
}

Assistant:

int mbedtls_ssl_ciphersuite_uses_psk( const mbedtls_ssl_ciphersuite_t *info )
{
    switch( info->key_exchange )
    {
        case MBEDTLS_KEY_EXCHANGE_PSK:
        case MBEDTLS_KEY_EXCHANGE_RSA_PSK:
        case MBEDTLS_KEY_EXCHANGE_DHE_PSK:
        case MBEDTLS_KEY_EXCHANGE_ECDHE_PSK:
            return( 1 );

        default:
            return( 0 );
    }
}